

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.cpp
# Opt level: O0

void * __thiscall
pstd::pmr::NewDeleteResource::do_allocate(NewDeleteResource *this,size_t size,size_t alignment)

{
  int iVar1;
  ulong in_RDX;
  size_t in_RSI;
  void *ptr;
  void *local_28 [4];
  void *local_8;
  
  if (in_RDX < 8) {
    local_8 = malloc(in_RSI);
  }
  else {
    iVar1 = posix_memalign(local_28,in_RDX,in_RSI);
    if (iVar1 != 0) {
      local_28[0] = (void *)0x0;
    }
    local_8 = local_28[0];
  }
  return local_8;
}

Assistant:

void *do_allocate(size_t size, size_t alignment) {
#if defined(PBRT_HAVE__ALIGNED_MALLOC)
        return _aligned_malloc(size, alignment);
#elif defined(PBRT_HAVE_POSIX_MEMALIGN)
        void *ptr;
        if (alignment < sizeof(void *))
            return malloc(size);
        if (posix_memalign(&ptr, alignment, size) != 0)
            ptr = nullptr;
        return ptr;
#else
        return memalign(alignment, size);
#endif
    }